

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCOBBTree.cpp
# Opt level: O3

void chrono::collision::get_centroid_geometries
               (PQP_REAL *c,
               vector<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
               *mgeos,int firstgeo,int ngeos)

{
  long lVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  Vector baricenter;
  double local_48;
  double dStack_40;
  double local_38;
  
  auVar3 = ZEXT816(0) << 0x40;
  c[2] = 0.0;
  *(undefined1 (*) [16])c = auVar3;
  if (ngeos < 1) {
    dVar4 = 0.0;
  }
  else {
    lVar1 = (long)firstgeo;
    uVar2 = (ulong)(uint)ngeos;
    do {
      (*(mgeos->
        super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
        )._M_impl.super__Vector_impl_data._M_start[lVar1]->_vptr_ChGeometry[6])(&local_48);
      lVar1 = lVar1 + 1;
      uVar2 = uVar2 - 1;
      auVar3._0_8_ = local_48 + *c;
      auVar3._8_8_ = dStack_40 + c[1];
      *(undefined1 (*) [16])c = auVar3;
      dVar4 = local_38 + c[2];
      c[2] = dVar4;
    } while (uVar2 != 0);
  }
  dVar5 = (double)ngeos;
  auVar6._8_8_ = dVar5;
  auVar6._0_8_ = dVar5;
  auVar3 = vdivpd_avx(auVar3,auVar6);
  *(undefined1 (*) [16])c = auVar3;
  c[2] = dVar4 / dVar5;
  return;
}

Assistant:

void get_centroid_geometries(PQP_REAL c[3], std::vector<geometry::ChGeometry*>& mgeos, int firstgeo, int ngeos) {
    c[0] = c[1] = c[2] = 0.0;

    // get center of mass
    geometry::ChGeometry* nit;
    for (int count = 0; count < ngeos; ++count) {
        nit = mgeos[firstgeo + count];

        Vector baricenter = nit->Baricenter();

        c[0] += baricenter.x();
        c[1] += baricenter.y();
        c[2] += baricenter.z();
    }

    c[0] /= ngeos;
    c[1] /= ngeos;
    c[2] /= ngeos;
}